

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlSwitchEncoding(xmlParserCtxtPtr ctxt,xmlCharEncoding enc)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  int iVar3;
  xmlCharEncodingHandlerPtr handler;
  xmlChar *pxVar4;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  switch(enc) {
  case XML_CHAR_ENCODING_NONE:
    goto switchD_0016a09a_caseD_0;
  case XML_CHAR_ENCODING_UTF8:
    ctxt->charset = 1;
    pxVar1 = ctxt->input;
    if (pxVar1 == (xmlParserInputPtr)0x0) {
      return 0;
    }
    pxVar4 = pxVar1->cur;
    if (*pxVar4 != 0xef) {
      return 0;
    }
    if (pxVar4[1] != 0xbb) {
      return 0;
    }
    if (pxVar4[2] == 0xbf) {
      pxVar1->cur = pxVar4 + 3;
      return 0;
    }
    return 0;
  case XML_CHAR_ENCODING_UTF16LE:
  case XML_CHAR_ENCODING_UTF16BE:
    pxVar1 = ctxt->input;
    iVar2 = 0x5a;
    if ((((pxVar1 != (xmlParserInputPtr)0x0) && (pxVar4 = pxVar1->cur, pxVar4 != (xmlChar *)0x0)) &&
        (*pxVar4 == 0xef)) && ((pxVar4[1] == 0xbb && (pxVar4[2] == 0xbf)))) {
      pxVar1->cur = pxVar4 + 3;
    }
    break;
  case XML_CHAR_ENCODING_UCS4LE:
  case XML_CHAR_ENCODING_UCS4BE:
  case XML_CHAR_ENCODING_UCS4_2143:
  case XML_CHAR_ENCODING_UCS4_3412:
    iVar2 = 0xb4;
    break;
  case XML_CHAR_ENCODING_EBCDIC:
  case XML_CHAR_ENCODING_8859_1:
  case XML_CHAR_ENCODING_8859_2:
  case XML_CHAR_ENCODING_8859_3:
  case XML_CHAR_ENCODING_8859_4:
  case XML_CHAR_ENCODING_8859_5:
  case XML_CHAR_ENCODING_8859_6:
  case XML_CHAR_ENCODING_8859_7:
  case XML_CHAR_ENCODING_8859_8:
  case XML_CHAR_ENCODING_8859_9:
  case XML_CHAR_ENCODING_2022_JP:
  case XML_CHAR_ENCODING_SHIFT_JIS:
  case XML_CHAR_ENCODING_EUC_JP:
  case XML_CHAR_ENCODING_ASCII:
    iVar2 = 0x2d;
    break;
  case XML_CHAR_ENCODING_UCS2:
    iVar2 = 0x5a;
    break;
  case XML_CHAR_ENCODING_ERROR:
    __xmlErrEncoding(ctxt,XML_ERR_UNKNOWN_ENCODING,"encoding unknown\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
    return -1;
  default:
    iVar2 = -1;
  }
  handler = xmlGetCharEncodingHandler(enc);
  if (handler == (xmlCharEncodingHandlerPtr)0x0) {
    if (enc == XML_CHAR_ENCODING_8859_1) {
      if (((ctxt->inputNr == 1) && (ctxt->encoding == (xmlChar *)0x0)) &&
         ((ctxt->input != (xmlParserInputPtr)0x0 &&
          (pxVar4 = ctxt->input->encoding, pxVar4 != (xmlChar *)0x0)))) {
        pxVar4 = xmlStrdup(pxVar4);
        ctxt->encoding = pxVar4;
      }
      ctxt->charset = 10;
    }
    else {
      if (enc != XML_CHAR_ENCODING_ASCII) {
        pxVar4 = (xmlChar *)xmlGetCharEncodingName(enc);
        __xmlErrEncoding(ctxt,XML_ERR_UNSUPPORTED_ENCODING,"encoding not supported: %s\n",pxVar4,
                         (xmlChar *)0x0);
        xmlStopParser(ctxt);
        return -1;
      }
switchD_0016a09a_caseD_0:
      ctxt->charset = 1;
    }
    iVar3 = 0;
  }
  else {
    iVar2 = xmlSwitchInputEncodingInt(ctxt,ctxt->input,handler,iVar2);
    if ((iVar2 < 0) || (iVar3 = 0, ctxt->errNo == 0x1773)) {
      xmlStopParser(ctxt);
      ctxt->errNo = 0x1773;
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int
xmlSwitchEncoding(xmlParserCtxtPtr ctxt, xmlCharEncoding enc)
{
    xmlCharEncodingHandlerPtr handler;
    int len = -1;
    int ret;

    if (ctxt == NULL) return(-1);
    switch (enc) {
	case XML_CHAR_ENCODING_ERROR:
	    __xmlErrEncoding(ctxt, XML_ERR_UNKNOWN_ENCODING,
	                   "encoding unknown\n", NULL, NULL);
	    return(-1);
	case XML_CHAR_ENCODING_NONE:
	    /* let's assume it's UTF-8 without the XML decl */
	    ctxt->charset = XML_CHAR_ENCODING_UTF8;
	    return(0);
	case XML_CHAR_ENCODING_UTF8:
	    /* default encoding, no conversion should be needed */
	    ctxt->charset = XML_CHAR_ENCODING_UTF8;

	    /*
	     * Errata on XML-1.0 June 20 2001
	     * Specific handling of the Byte Order Mark for
	     * UTF-8
	     */
	    if ((ctxt->input != NULL) &&
		(ctxt->input->cur[0] == 0xEF) &&
		(ctxt->input->cur[1] == 0xBB) &&
		(ctxt->input->cur[2] == 0xBF)) {
		ctxt->input->cur += 3;
	    }
	    return(0);
    case XML_CHAR_ENCODING_UTF16LE:
    case XML_CHAR_ENCODING_UTF16BE:
        /*The raw input characters are encoded
         *in UTF-16. As we expect this function
         *to be called after xmlCharEncInFunc, we expect
         *ctxt->input->cur to contain UTF-8 encoded characters.
         *So the raw UTF16 Byte Order Mark
         *has also been converted into
         *an UTF-8 BOM. Let's skip that BOM.
         */
        if ((ctxt->input != NULL) && (ctxt->input->cur != NULL) &&
            (ctxt->input->cur[0] == 0xEF) &&
            (ctxt->input->cur[1] == 0xBB) &&
            (ctxt->input->cur[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }
        len = 90;
	break;
    case XML_CHAR_ENCODING_UCS2:
        len = 90;
	break;
    case XML_CHAR_ENCODING_UCS4BE:
    case XML_CHAR_ENCODING_UCS4LE:
    case XML_CHAR_ENCODING_UCS4_2143:
    case XML_CHAR_ENCODING_UCS4_3412:
        len = 180;
	break;
    case XML_CHAR_ENCODING_EBCDIC:
    case XML_CHAR_ENCODING_8859_1:
    case XML_CHAR_ENCODING_8859_2:
    case XML_CHAR_ENCODING_8859_3:
    case XML_CHAR_ENCODING_8859_4:
    case XML_CHAR_ENCODING_8859_5:
    case XML_CHAR_ENCODING_8859_6:
    case XML_CHAR_ENCODING_8859_7:
    case XML_CHAR_ENCODING_8859_8:
    case XML_CHAR_ENCODING_8859_9:
    case XML_CHAR_ENCODING_ASCII:
    case XML_CHAR_ENCODING_2022_JP:
    case XML_CHAR_ENCODING_SHIFT_JIS:
    case XML_CHAR_ENCODING_EUC_JP:
        len = 45;
	break;
    }
    handler = xmlGetCharEncodingHandler(enc);
    if (handler == NULL) {
	/*
	 * Default handlers.
	 */
	switch (enc) {
	    case XML_CHAR_ENCODING_ASCII:
		/* default encoding, no conversion should be needed */
		ctxt->charset = XML_CHAR_ENCODING_UTF8;
		return(0);
	    case XML_CHAR_ENCODING_8859_1:
		if ((ctxt->inputNr == 1) &&
		    (ctxt->encoding == NULL) &&
		    (ctxt->input != NULL) &&
		    (ctxt->input->encoding != NULL)) {
		    ctxt->encoding = xmlStrdup(ctxt->input->encoding);
		}
		ctxt->charset = enc;
		return(0);
	    default:
		__xmlErrEncoding(ctxt, XML_ERR_UNSUPPORTED_ENCODING,
                        "encoding not supported: %s\n",
			BAD_CAST xmlGetCharEncodingName(enc), NULL);
                /*
                 * TODO: We could recover from errors in external entities
                 * if we didn't stop the parser. But most callers of this
                 * function don't check the return value.
                 */
                xmlStopParser(ctxt);
                return(-1);
        }
    }
    ret = xmlSwitchInputEncodingInt(ctxt, ctxt->input, handler, len);
    if ((ret < 0) || (ctxt->errNo == XML_I18N_CONV_FAILED)) {
        /*
	 * on encoding conversion errors, stop the parser
	 */
        xmlStopParser(ctxt);
	ctxt->errNo = XML_I18N_CONV_FAILED;
    }
    return(ret);
}